

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void google::protobuf::compiler::CommandLineInterface::GetTransitiveDependencies
               (FileDescriptor *file,bool include_json_name,bool include_source_code_info,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *already_seen,RepeatedPtrField<google::protobuf::FileDescriptorProto> *output)

{
  int iVar1;
  FileDescriptor *file_00;
  FileDescriptorProto *proto;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar2;
  FileDescriptorProto *new_descriptor;
  int i;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output_local;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *already_seen_local;
  bool include_source_code_info_local;
  FileDescriptor *pFStack_10;
  bool include_json_name_local;
  FileDescriptor *file_local;
  
  pFStack_10 = file;
  pVar2 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert(already_seen,&stack0xfffffffffffffff0);
  if (((pVar2.second ^ 0xffU) & 1) == 0) {
    for (new_descriptor._4_4_ = 0; iVar1 = FileDescriptor::dependency_count(pFStack_10),
        new_descriptor._4_4_ < iVar1; new_descriptor._4_4_ = new_descriptor._4_4_ + 1) {
      file_00 = FileDescriptor::dependency(pFStack_10,new_descriptor._4_4_);
      GetTransitiveDependencies
                (file_00,include_json_name,include_source_code_info,already_seen,output);
    }
    proto = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(output);
    FileDescriptor::CopyTo(pFStack_10,proto);
    if (include_json_name) {
      FileDescriptor::CopyJsonNameTo(pFStack_10,proto);
    }
    if (include_source_code_info) {
      FileDescriptor::CopySourceCodeInfoTo(pFStack_10,proto);
    }
  }
  return;
}

Assistant:

void CommandLineInterface::GetTransitiveDependencies(
    const FileDescriptor* file,
    bool include_json_name,
    bool include_source_code_info,
    std::set<const FileDescriptor*>* already_seen,
    RepeatedPtrField<FileDescriptorProto>* output) {
  if (!already_seen->insert(file).second) {
    // Already saw this file.  Skip.
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); i++) {
    GetTransitiveDependencies(file->dependency(i),
                              include_json_name,
                              include_source_code_info,
                              already_seen, output);
  }

  // Add this file.
  FileDescriptorProto* new_descriptor = output->Add();
  file->CopyTo(new_descriptor);
  if (include_json_name) {
    file->CopyJsonNameTo(new_descriptor);
  }
  if (include_source_code_info) {
    file->CopySourceCodeInfoTo(new_descriptor);
  }
}